

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

int luaH_psetshortstr(Table *t,TString *key,TValue *val)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  TValue *io1;
  TValue *pTVar4;
  TValue tk;
  Value local_20;
  byte local_18;
  
  pTVar4 = (TValue *)(t->node + (~(-1 << (t->lsizenode & 0x1f)) & key->hash));
  do {
    if ((((NodeKey *)pTVar4)->key_tt == 'D') &&
       ((TString *)(((NodeKey *)pTVar4)->key_val).gc == key)) goto LAB_0011c5ff;
    piVar1 = &((NodeKey *)pTVar4)->next;
    pTVar4 = (TValue *)((long)pTVar4 + (long)*piVar1 * 0x18);
  } while ((long)*piVar1 != 0);
  pTVar4 = &absentkey;
LAB_0011c5ff:
  bVar3 = ((NodeKey *)pTVar4)->tt_;
  if ((bVar3 & 0xf) == 0) {
    if ((t->metatable == (Table *)0x0) || ((t->metatable->flags & 2) != 0)) {
      if ((val->tt_ & 0xf) == 0) {
        return 0;
      }
      if (bVar3 == 0x20) {
        if (((t->marked & 0x20) != 0) && ((key->marked & 0x18) != 0)) {
          return 1;
        }
        local_18 = key->tt | 0x40;
        local_20 = (Value)key;
        iVar2 = insertkey(t,(TValue *)&local_20,val);
        if (iVar2 != 0) {
          t->flags = t->flags & 0xc0;
          goto LAB_0011c615;
        }
        bVar3 = ((NodeKey *)pTVar4)->tt_;
      }
    }
    iVar2 = 1;
    if (bVar3 != 0x20) {
      iVar2 = (int)((ulong)((long)pTVar4 - (long)t->node) >> 3) * -0x55555555 + 3;
    }
  }
  else {
    ((NodeKey *)pTVar4)->value_ = val->value_;
    ((NodeKey *)pTVar4)->tt_ = val->tt_;
LAB_0011c615:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int luaH_psetshortstr (Table *t, TString *key, TValue *val) {
  const TValue *slot = luaH_Hgetshortstr(t, key);
  if (!ttisnil(slot)) {  /* key already has a value? (all too common) */
    setobj(((lua_State*)NULL), cast(TValue*, slot), val);  /* update it */
    return HOK;  /* done */
  }
  else if (checknoTM(t->metatable, TM_NEWINDEX)) {  /* no metamethod? */
    if (ttisnil(val))  /* new value is nil? */
      return HOK;  /* done (value is already nil/absent) */
    if (isabstkey(slot) &&  /* key is absent? */
       !(isblack(t) && iswhite(key))) {  /* and don't need barrier? */
      TValue tk;  /* key as a TValue */
      setsvalue(cast(lua_State *, NULL), &tk, key);
      if (insertkey(t, &tk, val)) {  /* insert key, if there is space */
        invalidateTMcache(t);
        return HOK;
      }
    }
  }
  /* Else, either table has new-index metamethod, or it needs barrier,
     or it needs to rehash for the new key. In any of these cases, the
     operation cannot be completed here. Return a code for the caller. */
  return retpsetcode(t, slot);
}